

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int bsreadlnsa(bstring r,bStream *s,const_bstring term)

{
  bstring ptVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar8;
  ulong uVar9;
  int len;
  long lVar10;
  uchar *puVar11;
  tagbstring x;
  charField cf;
  tagbstring local_60;
  charField local_50;
  size_t sVar7;
  
  iVar3 = -1;
  if (((((s != (bStream *)0x0) && (term != (const_bstring)0x0)) && (r != (bstring)0x0)) &&
      ((ptVar1 = s->buff, ptVar1 != (bstring)0x0 && (term->data != (uchar *)0x0)))) &&
     ((0 < r->mlen && ((uint)r->slen <= (uint)r->mlen)))) {
    if (term->slen == 1) {
      iVar3 = bsreadlna(r,s,*term->data);
      return iVar3;
    }
    if ((0 < term->slen) && (iVar4 = buildCharField(&local_50,term), iVar4 == 0)) {
      iVar4 = ptVar1->slen;
      iVar5 = balloc(ptVar1,s->maxBuffSz + 1);
      if (iVar5 == 0) {
        local_60.data = s->buff->data;
        local_60.data[iVar4] = *term->data;
        lVar2 = 0;
        do {
          lVar10 = lVar2;
          lVar2 = lVar10 + 1;
        } while ((local_50.content[local_60.data[lVar10] >> 3] >> (local_60.data[lVar10] & 7) & 1)
                 == 0);
        if ((int)lVar10 < iVar4) {
          len = (int)(lVar10 + 1);
          local_60.slen = len;
          iVar5 = bconcat(r,&local_60);
          ptVar1 = s->buff;
          ptVar1->slen = iVar4;
          iVar3 = 0;
          if (iVar5 == 0) {
            iVar3 = 0;
            bdelete(ptVar1,0,len);
          }
        }
        else {
          iVar5 = r->slen;
          local_60.slen = iVar4;
          iVar4 = bconcat(r,&local_60);
          if (iVar4 == 0) {
            for (iVar4 = balloc(r,r->slen + s->maxBuffSz + 1); iVar4 == 0;
                iVar4 = balloc(r,s->maxBuffSz + iVar4 + 1)) {
              puVar11 = r->data + r->slen;
              sVar7 = (*s->readFnPtr)(puVar11,1,(long)s->maxBuffSz,s->parm);
              uVar6 = (uint)sVar7;
              if ((int)uVar6 < 1) {
                r->data[r->slen] = '\0';
                s->buff->slen = 0;
                s->isEOF = 1;
                return -(uint)(r->slen == iVar5);
              }
              puVar11[uVar6 & 0x7fffffff] = *term->data;
              uVar9 = 0;
              do {
                uVar8 = uVar9;
                uVar9 = uVar8 + 1;
              } while ((local_50.content[puVar11[uVar8] >> 3] >> (puVar11[uVar8] & 7) & 1) == 0);
              if ((int)uVar8 < (int)uVar6) {
                r->slen = r->slen + (int)uVar9;
                iVar3 = uVar6 - (int)uVar9;
                ptVar1 = s->buff;
                ptVar1->slen = iVar3;
                memcpy(ptVar1->data,puVar11 + (uVar9 & 0xffffffff),(long)iVar3);
                r->data[r->slen] = '\0';
                return 0;
              }
              iVar4 = r->slen + uVar6;
              r->slen = iVar4;
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int bsreadlnsa (bstring r, struct bStream * s, const_bstring term) {
int i, l, ret, rlo;
unsigned char * b;
struct tagbstring x;
struct charField cf;

	if (s == NULL || s->buff == NULL || r == NULL || term == NULL ||
	    term->data == NULL || r->mlen <= 0 || r->slen < 0 ||
	    r->mlen < r->slen) return BSTR_ERR;
	if (term->slen == 1) return bsreadlna (r, s, term->data[0]);
	if (term->slen < 1 || buildCharField (&cf, term)) return BSTR_ERR;

	l = s->buff->slen;
	if (BSTR_OK != balloc (s->buff, s->maxBuffSz + 1)) return BSTR_ERR;
	b = (unsigned char *) s->buff->data;
	x.data = b;

	/* First check if the current buffer holds the terminator */
	b[l] = term->data[0]; /* Set sentinel */
	for (i=0; !testInCharField (&cf, b[i]); i++) ;
	if (i < l) {
		x.slen = i + 1;
		ret = bconcat (r, &x);
		s->buff->slen = l;
		if (BSTR_OK == ret) bdelete (s->buff, 0, i + 1);
		return BSTR_OK;
	}

	rlo = r->slen;

	/* If not then just concatenate the entire buffer to the output */
	x.slen = l;
	if (BSTR_OK != bconcat (r, &x)) return BSTR_ERR;

	/* Perform direct in-place reads into the destination to allow for
	   the minimum of data-copies */
	for (;;) {
		if (BSTR_OK != balloc (r, r->slen + s->maxBuffSz + 1))
		    return BSTR_ERR;
		b = (unsigned char *) (r->data + r->slen);
		l = (int) s->readFnPtr (b, 1, s->maxBuffSz, s->parm);
		if (l <= 0) {
			r->data[r->slen] = (unsigned char) '\0';
			s->buff->slen = 0;
			s->isEOF = 1;
			/* If nothing was read return with an error message */
			return BSTR_ERR & -(r->slen == rlo);
		}

		b[l] = term->data[0]; /* Set sentinel */
		for (i=0; !testInCharField (&cf, b[i]); i++) ;
		if (i < l) break;
		r->slen += l;
	}

	/* Terminator found, push over-read back to buffer */
	i++;
	r->slen += i;
	s->buff->slen = l - i;
	bstr__memcpy (s->buff->data, b + i, l - i);
	r->data[r->slen] = (unsigned char) '\0';
	return BSTR_OK;
}